

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O3

void __thiscall QPDFJob::Members::~Members(Members *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer puVar4;
  _Manager_type p_Var5;
  
  std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::~vector
            (&this->page_label_specs);
  pcVar2 = (this->update_from_json)._M_dataplus._M_p;
  paVar1 = &(this->update_from_json).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
  ::~_Rb_tree(&(this->rotations)._M_t);
  std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::~vector(&this->page_specs);
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::~vector
            (&this->overlay);
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::~vector
            (&this->underlay);
  pcVar2 = (this->json_stream_prefix)._M_dataplus._M_p;
  paVar1 = &(this->json_stream_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->json_objects)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->json_keys)._M_t);
  std::__cxx11::
  _List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::_M_clear
            (&(this->attachments_to_copy).
              super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
            );
  std::__cxx11::_List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::
  _M_clear(&(this->attachments_to_add).
            super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->attachments_to_remove).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  pcVar2 = (this->attachment_to_show)._M_dataplus._M_p;
  paVar1 = &(this->attachment_to_show).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = (this->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->collate).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pcVar2 = (this->force_version)._M_dataplus._M_p;
  paVar1 = &(this->force_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->min_version)._M_dataplus._M_p;
  paVar1 = &(this->min_version).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->linearize_pass1)._M_dataplus._M_p;
  paVar1 = &(this->linearize_pass1).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->owner_password)._M_dataplus._M_p;
  paVar1 = &(this->owner_password).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->user_password)._M_dataplus._M_p;
  paVar1 = &(this->user_password).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->encryption_file_password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar2 = (this->encryption_file)._M_dataplus._M_p;
  paVar1 = &(this->encryption_file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->progress_handler).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->progress_handler,(_Any_data *)&this->progress_handler,
              __destroy_functor);
  }
  p_Var3 = (this->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar2 = (this->message_prefix)._M_dataplus._M_p;
  paVar1 = &(this->message_prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

QPDF_DLL
        ~Members() = default;